

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

bool __thiscall
chaiscript::dispatch::
Attribute_Access<chaiscript::Boxed_Value,_std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>_>
::operator==(Attribute_Access<chaiscript::Boxed_Value,_std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>_>
             *this,Proxy_Function_Base *t_func)

{
  long local_40;
  Attribute_Access<chaiscript::Boxed_Value,_std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>_>
  *aa;
  Proxy_Function_Base *t_func_local;
  Attribute_Access<chaiscript::Boxed_Value,_std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>_>
  *this_local;
  
  if (t_func == (Proxy_Function_Base *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = __dynamic_cast(t_func,&Proxy_Function_Base::typeinfo,
                              &Attribute_Access<chaiscript::Boxed_Value,std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>>
                               ::typeinfo,0);
  }
  if (local_40 == 0) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ =
         this->m_attr ==
         *(offset_in_pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>_to_Boxed_Value *)
          (local_40 + 0x40);
  }
  return this_local._7_1_;
}

Assistant:

bool operator==(const Proxy_Function_Base &t_func) const noexcept override {
        const Attribute_Access<T, Class> *aa = dynamic_cast<const Attribute_Access<T, Class> *>(&t_func);

        if (aa) {
          return m_attr == aa->m_attr;
        } else {
          return false;
        }
      }